

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

void stbtt_GetBakedQuad(stbtt_bakedchar *chardata,int pw,int ph,int char_index,float *xpos,
                       float *ypos,stbtt_aligned_quad *q,int opengl_fillrule)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  
  if (opengl_fillrule == 0) {
    fVar5 = -0.5;
  }
  else {
    fVar5 = 0.0;
  }
  auVar8._4_4_ = (float)ph;
  auVar8._0_4_ = (float)pw;
  uVar1 = chardata[char_index].xoff;
  uVar2 = chardata[char_index].yoff;
  fVar7 = *ypos;
  fVar6 = floorf(*xpos + (float)uVar1 + 0.5);
  fVar7 = floorf(fVar7 + (float)uVar2 + 0.5);
  q->x0 = (float)(int)fVar6 + fVar5;
  q->y0 = (float)(int)fVar7 + fVar5;
  auVar8._8_8_ = 0;
  auVar8 = divps(_DAT_0016e160,auVar8);
  uVar3._0_2_ = chardata[char_index].x0;
  uVar3._2_2_ = chardata[char_index].y0;
  uVar4._0_2_ = chardata[char_index].x1;
  uVar4._2_2_ = chardata[char_index].y1;
  q->s0 = (float)(uVar3 & 0xffff) * auVar8._0_4_;
  q->t0 = (float)(uVar3 >> 0x10) * auVar8._4_4_;
  q->x1 = (float)(int)(((int)fVar6 + (uVar4 & 0xffff)) - (uVar3 & 0xffff)) + fVar5;
  q->y1 = (float)(int)(((int)fVar7 + (uVar4 >> 0x10)) - (uVar3 >> 0x10)) + fVar5;
  q->s1 = (float)(uVar4 & 0xffff) * auVar8._0_4_;
  q->t1 = (float)(uVar4 >> 0x10) * auVar8._4_4_;
  *xpos = chardata[char_index].xadvance + *xpos;
  return;
}

Assistant:

STBTT_DEF void stbtt_GetBakedQuad(const stbtt_bakedchar *chardata, int pw, int ph, int char_index, float *xpos, float *ypos, stbtt_aligned_quad *q, int opengl_fillrule)
{
   float d3d_bias = opengl_fillrule ? 0 : -0.5f;
   float ipw = 1.0f / pw, iph = 1.0f / ph;
   const stbtt_bakedchar *b = chardata + char_index;
   int round_x = STBTT_ifloor((*xpos + b->xoff) + 0.5f);
   int round_y = STBTT_ifloor((*ypos + b->yoff) + 0.5f);

   q->x0 = round_x + d3d_bias;
   q->y0 = round_y + d3d_bias;
   q->x1 = round_x + b->x1 - b->x0 + d3d_bias;
   q->y1 = round_y + b->y1 - b->y0 + d3d_bias;

   q->s0 = b->x0 * ipw;
   q->t0 = b->y0 * iph;
   q->s1 = b->x1 * ipw;
   q->t1 = b->y1 * iph;

   *xpos += b->xadvance;
}